

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::PointerPrinter::PrintValue<upb_test_TestRequiredFields>
               (upb_test_TestRequiredFields *p,ostream *os)

{
  if (p != (upb_test_TestRequiredFields *)0x0) {
    std::ostream::_M_insert<void_const*>(os);
    return;
  }
  std::operator<<(os,"NULL");
  return;
}

Assistant:

static void PrintValue(T* p, ::std::ostream* os) {
    if (p == nullptr) {
      *os << "NULL";
    } else {
      // T is not a function type.  We just call << to print p,
      // relying on ADL to pick up user-defined << for their pointer
      // types, if any.
      *os << p;
    }
  }